

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

bool __thiscall
cmMakefile::CompileFeatureKnown
          (cmMakefile *this,cmTarget *target,string *feature,string *lang,string *error)

{
  size_type sVar1;
  char **ppcVar2;
  char **ppcVar3;
  ostream *poVar4;
  string *psVar5;
  cmake *this_00;
  bool bVar6;
  string local_248;
  string local_228 [32];
  undefined1 local_208 [8];
  ostringstream e;
  cmStrCmp local_90;
  undefined1 local_6d;
  bool isCxxFeature;
  cmStrCmp local_60;
  undefined1 local_39;
  string *psStack_38;
  bool isCFeature;
  string *error_local;
  string *lang_local;
  string *feature_local;
  cmTarget *target_local;
  cmMakefile *this_local;
  
  psStack_38 = error;
  error_local = lang;
  lang_local = feature;
  feature_local = (string *)target;
  target_local = (cmTarget *)this;
  sVar1 = cmGeneratorExpression::Find(feature);
  if (sVar1 == 0xffffffffffffffff) {
    ppcVar2 = cmArrayBegin<char_const*,8ul>(&C_FEATURES);
    ppcVar3 = cmArrayEnd<char_const*,8ul>(&C_FEATURES);
    cmStrCmp::cmStrCmp(&local_60,lang_local);
    ppcVar2 = std::find_if<char_const*const*,cmStrCmp>(ppcVar2 + 1,ppcVar3,&local_60);
    ppcVar3 = cmArrayEnd<char_const*,8ul>(&C_FEATURES);
    bVar6 = ppcVar2 != ppcVar3;
    cmStrCmp::~cmStrCmp(&local_60);
    local_39 = bVar6;
    if (bVar6) {
      std::__cxx11::string::operator=((string *)error_local,"C");
      this_local._7_1_ = 1;
    }
    else {
      ppcVar2 = cmArrayBegin<char_const*,62ul>(&CXX_FEATURES);
      ppcVar3 = cmArrayEnd<char_const*,62ul>(&CXX_FEATURES);
      cmStrCmp::cmStrCmp(&local_90,lang_local);
      ppcVar2 = std::find_if<char_const*const*,cmStrCmp>(ppcVar2 + 1,ppcVar3,&local_90);
      ppcVar3 = cmArrayEnd<char_const*,62ul>(&CXX_FEATURES);
      bVar6 = ppcVar2 != ppcVar3;
      cmStrCmp::~cmStrCmp(&local_90);
      local_6d = bVar6;
      if (bVar6) {
        std::__cxx11::string::operator=((string *)error_local,"CXX");
        this_local._7_1_ = 1;
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_208);
        if (psStack_38 == (string *)0x0) {
          std::operator<<((ostream *)local_208,"Specified");
        }
        else {
          std::operator<<((ostream *)local_208,"specified");
        }
        poVar4 = std::operator<<((ostream *)local_208," unknown feature \"");
        poVar4 = std::operator<<(poVar4,(string *)lang_local);
        poVar4 = std::operator<<(poVar4,"\" for target \"");
        psVar5 = cmTarget::GetName_abi_cxx11_((cmTarget *)feature_local);
        poVar4 = std::operator<<(poVar4,(string *)psVar5);
        std::operator<<(poVar4,"\".");
        if (psStack_38 == (string *)0x0) {
          this_00 = GetCMakeInstance(this);
          std::__cxx11::ostringstream::str();
          cmake::IssueMessage(this_00,FATAL_ERROR,&local_248,&this->Backtrace);
          std::__cxx11::string::~string((string *)&local_248);
        }
        else {
          std::__cxx11::ostringstream::str();
          std::__cxx11::string::operator=((string *)psStack_38,local_228);
          std::__cxx11::string::~string(local_228);
        }
        this_local._7_1_ = 0;
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_208);
      }
    }
    return (bool)(this_local._7_1_ & 1);
  }
  __assert_fail("cmGeneratorExpression::Find(feature) == std::string::npos",
                "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmMakefile.cxx"
                ,0x1055,
                "bool cmMakefile::CompileFeatureKnown(const cmTarget *, const std::string &, std::string &, std::string *) const"
               );
}

Assistant:

bool cmMakefile::CompileFeatureKnown(cmTarget const* target,
                                     const std::string& feature,
                                     std::string& lang,
                                     std::string* error) const
{
  assert(cmGeneratorExpression::Find(feature) == std::string::npos);

  bool isCFeature =
    std::find_if(cmArrayBegin(C_FEATURES) + 1, cmArrayEnd(C_FEATURES),
                 cmStrCmp(feature)) != cmArrayEnd(C_FEATURES);
  if (isCFeature) {
    lang = "C";
    return true;
  }
  bool isCxxFeature =
    std::find_if(cmArrayBegin(CXX_FEATURES) + 1, cmArrayEnd(CXX_FEATURES),
                 cmStrCmp(feature)) != cmArrayEnd(CXX_FEATURES);
  if (isCxxFeature) {
    lang = "CXX";
    return true;
  }
  std::ostringstream e;
  if (error) {
    e << "specified";
  } else {
    e << "Specified";
  }
  e << " unknown feature \"" << feature << "\" for "
                                           "target \""
    << target->GetName() << "\".";
  if (error) {
    *error = e.str();
  } else {
    this->GetCMakeInstance()->IssueMessage(cmake::FATAL_ERROR, e.str(),
                                           this->Backtrace);
  }
  return false;
}